

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateTime.h
# Opt level: O1

string * __thiscall DateTime::ToString_abi_cxx11_(string *__return_storage_ptr__,DateTime *this)

{
  long lVar1;
  undefined1 auVar2 [16];
  char cVar3;
  ostream *poVar4;
  int day;
  int month;
  int year;
  stringstream ss;
  undefined1 auStack_1b8 [4];
  int local_1b4;
  int local_1b0;
  int local_1ac;
  stringstream local_1a8 [16];
  long local_198 [2];
  undefined8 uStack_188;
  uint auStack_180 [22];
  ios_base local_128 [112];
  char acStack_b8 [152];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  FromTicks(this,&local_1ac,&local_1b0,&local_1b4);
  *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) =
       *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) & 0xffffff4f | 0x80;
  lVar1 = *(long *)(local_198[0] + -0x18);
  if (acStack_b8[lVar1 + 1] == '\0') {
    cVar3 = std::ios::widen((char)auStack_1b8 + (char)lVar1 + ' ');
    acStack_b8[lVar1] = cVar3;
    acStack_b8[lVar1 + 1] = '\x01';
  }
  acStack_b8[lVar1] = '0';
  *(undefined8 *)((long)&uStack_188 + *(long *)(local_198[0] + -0x18)) = 4;
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_198,local_1ac);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"-",1);
  *(undefined8 *)((long)&uStack_188 + *(long *)(local_198[0] + -0x18)) = 2;
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_198,local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"-",1);
  *(undefined8 *)((long)&uStack_188 + *(long *)(local_198[0] + -0x18)) = 2;
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_198,local_1b4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  *(undefined8 *)((long)&uStack_188 + *(long *)(local_198[0] + -0x18)) = 2;
  auVar2 = SEXT816(this->m_encoded % 86400000000) * ZEXT816(0x98b5bf2c03e529c5);
  poVar4 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)local_198,(int)(auVar2._8_8_ >> 0x1f) - (auVar2._12_4_ >> 0x1f));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
  *(undefined8 *)((long)&uStack_188 + *(long *)(local_198[0] + -0x18)) = 2;
  auVar2 = SEXT816(this->m_encoded % 3600000000) * ZEXT816(0x8f2a633943a6d729);
  poVar4 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)local_198,(int)(auVar2._8_8_ >> 0x19) - (auVar2._12_4_ >> 0x1f));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
  *(undefined8 *)((long)&uStack_188 + *(long *)(local_198[0] + -0x18)) = 2;
  auVar2 = SEXT816(this->m_encoded % 60000000) * SEXT816(0x431bde82d7b634db);
  poVar4 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)local_198,(int)(auVar2._8_8_ >> 0x12) - (auVar2._12_4_ >> 0x1f));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,".",1);
  *(undefined8 *)((long)&uStack_188 + *(long *)(local_198[0] + -0x18)) = 6;
  auVar2 = SEXT816(this->m_encoded) * SEXT816(0x431bde82d7b634db);
  poVar4 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)local_198,
                      (int)this->m_encoded +
                      ((int)(auVar2._8_8_ >> 0x12) - (auVar2._12_4_ >> 0x1f)) * -1000000);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," UTC",4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const
    {
        std::stringstream ss;
        int year;
        int month;
        int day;
        FromTicks(year, month, day);
        ss << std::right << std::setfill('0');
        ss << std::setw(4) << year << "-";
        ss << std::setw(2) << month << "-";
        ss << std::setw(2) << day << " ";
        ss << std::setw(2) << Hour() << ":";
        ss << std::setw(2) << Minute() << ":";
        ss << std::setw(2) << Second() << ".";
        ss << std::setw(6) << Microsecond() << " UTC";
        return ss.str();
    }